

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg6.c
# Opt level: O3

wchar_t borg_attack_aux_rod_bolt_unknown(wchar_t dam,wchar_t typ)

{
  ushort uVar1;
  angband_constants *paVar2;
  uint32_t uVar3;
  wchar_t wVar4;
  char *pcVar5;
  wchar_t wVar6;
  borg_item *__haystack;
  ulong uVar7;
  ulong uVar8;
  
  wVar6 = L'\0';
  wVar4 = L'\0';
  if (((borg_skill[0x65] == 0) && (wVar4 = wVar6, borg_skill[0x67] == 0)) && (borg_skill[0x6d] == 0)
     ) {
    if ((borg_simulate) && (uVar3 = Rand_div(100), (int)uVar3 < 5)) {
      return L'\0';
    }
    paVar2 = z_info;
    uVar1 = z_info->pack_size;
    if ((ulong)uVar1 != 0) {
      uVar7 = 0xffffffff;
      uVar8 = 0;
      __haystack = borg_items;
      do {
        if (((__haystack->tval == '\x18') && (__haystack->kind == 0)) &&
           ((__haystack->pval != 0 &&
            (pcVar5 = strstr(__haystack->desc,"tried"), pcVar5 == (char *)0x0)))) {
          uVar7 = uVar8 & 0xffffffff;
        }
        uVar8 = uVar8 + 1;
        __haystack = __haystack + 1;
      } while (uVar1 != uVar8);
      if ((wchar_t)uVar7 < L'\0') {
        wVar4 = L'\0';
      }
      else {
        wVar4 = borg_launch_bolt(L'\0',L'K',L'\0',(uint)paVar2->max_range,L'\0');
        if (borg_simulate == false) {
          pcVar5 = format("# Aiming unknown rod \'%s.\'",borg_items + uVar7);
          borg_note(pcVar5);
          borg_zap_slot = (wchar_t)uVar7;
          borg_keypress(0x7a);
          borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar7]);
          borg_keypress(0x35);
          successful_target = L'\xffffffff';
        }
      }
    }
  }
  return wVar4;
}

Assistant:

static int borg_attack_aux_rod_bolt_unknown(int dam, int typ)
{
    int i;
    int b_i = -1;
    int b_n;

    /* No firing while blind, confused, or hallucinating */
    if (borg_skill[BI_ISBLIND] || borg_skill[BI_ISCONFUSED]
        || borg_skill[BI_ISIMAGE])
        return (0);

    /* Paranoia */
    if (borg_simulate && (randint0(100) < 5))
        return (0);

    /* Look for an un-id'd wand */
    for (i = 0; i < z_info->pack_size; i++) {
        if (borg_items[i].tval != TV_ROD)
            continue;

        /* known */
        if (borg_items[i].kind)
            continue;

        /* No charges */
        if (!borg_items[i].pval)
            continue;

        /* Not an attacker */
        if (strstr(borg_items[i].desc, "tried"))
            continue;

        /* Select this rod */
        b_i = i;
    }

    /* None available */
    if (b_i < 0)
        return (0);

    /* Choose optimal location */
    b_n = borg_launch_bolt(0, dam, typ, z_info->max_range, 0);

    /* Simulation */
    if (borg_simulate)
        return (b_n);

    /* Log the message */
    borg_note(format("# Aiming unknown rod '%s.'", borg_items[b_i].desc));

    /* record the address to avoid certain bugs with inscriptions&amnesia */
    borg_zap_slot = b_i;

    /* Perform the action */
    borg_keypress('z');
    borg_keypress(all_letters_nohjkl[b_i]);

    /* Use target */
    borg_keypress('5');

    /* Set our shooting flag */
    successful_target = -1;

    /* Value */
    return (b_n);
}